

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O2

bool __thiscall
cbtPolyhedralConvexShape::initializePolyhedralFeatures
          (cbtPolyhedralConvexShape *this,int shiftVerticesByMargin)

{
  undefined1 (*pauVar1) [16];
  cbtScalar cVar2;
  undefined1 auVar3 [64];
  ulong uVar4;
  int iVar5;
  int iVar6;
  cbtConvexPolyhedron *this_00;
  cbtVector3 *pcVar7;
  ulong uVar8;
  long lVar9;
  Edge *pEVar10;
  int p;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [56];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [56];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  cbtVector3 cVar23;
  int v1;
  int v0;
  cbtAlignedObjectArray<cbtVector3> tmpVertices;
  cbtAlignedObjectArray<cbtVector3> shiftedPlaneEquations;
  cbtConvexHullComputer conv;
  cbtAlignedObjectArray<cbtVector3> planeEquations;
  cbtAlignedObjectArray<cbtVector3> orgVertices;
  
  if (this->m_polyhedron != (cbtConvexPolyhedron *)0x0) {
    (**this->m_polyhedron->_vptr_cbtConvexPolyhedron)();
    cbtAlignedFreeInternal(this->m_polyhedron);
  }
  this_00 = (cbtConvexPolyhedron *)cbtAlignedAllocInternal(0xb0,0x10);
  cbtConvexPolyhedron::cbtConvexPolyhedron(this_00);
  this->m_polyhedron = this_00;
  uVar12 = 0;
  orgVertices.m_ownsMemory = true;
  orgVertices.m_data = (cbtVector3 *)0x0;
  orgVertices.m_size = 0;
  orgVertices.m_capacity = 0;
  while( true ) {
    iVar5 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])(this);
    if (iVar5 <= (int)uVar12) break;
    pcVar7 = cbtAlignedObjectArray<cbtVector3>::expand(&orgVertices,(cbtVector3 *)&conv);
    (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1c])(this,(ulong)uVar12,pcVar7);
    uVar12 = uVar12 + 1;
  }
  conv.vertices.m_ownsMemory = true;
  conv.vertices.m_data = (cbtVector3 *)0x0;
  conv.vertices.m_size = 0;
  conv.vertices.m_capacity = 0;
  conv.edges.m_ownsMemory = true;
  conv.edges.m_data = (Edge *)0x0;
  conv.edges.m_size = 0;
  conv.edges.m_capacity = 0;
  conv.faces.m_ownsMemory = true;
  conv.faces.m_data = (int *)0x0;
  conv.faces.m_size = 0;
  conv.faces.m_capacity = 0;
  if (shiftVerticesByMargin == 0) {
    auVar19 = ZEXT1664(ZEXT816(0) << 0x40);
    cbtConvexHullComputer::compute
              (&conv,(orgVertices.m_data)->m_floats,0x10,orgVertices.m_size,0.0,0.0);
    auVar3._60_4_ = 0;
    auVar3._0_60_ = extraout_var_00;
    auVar16 = auVar3 << 0x20;
  }
  else {
    planeEquations.m_ownsMemory = true;
    planeEquations.m_data = (cbtVector3 *)0x0;
    planeEquations.m_size = 0;
    planeEquations.m_capacity = 0;
    cbtGeometryUtil::getPlaneEquationsFromVertices(&orgVertices,&planeEquations);
    lVar9 = 0;
    shiftedPlaneEquations.m_ownsMemory = true;
    shiftedPlaneEquations.m_data = (cbtVector3 *)0x0;
    shiftedPlaneEquations.m_size = 0;
    shiftedPlaneEquations.m_capacity = 0;
    for (lVar11 = 0; lVar11 < planeEquations.m_size; lVar11 = lVar11 + 1) {
      pauVar1 = (undefined1 (*) [16])((long)(planeEquations.m_data)->m_floats + lVar9);
      fVar14 = (float)*(undefined8 *)*pauVar1;
      tmpVertices._0_16_ = *pauVar1;
      (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xc])(this);
      tmpVertices._12_4_ = (float)tmpVertices._12_4_ - fVar14;
      cbtAlignedObjectArray<cbtVector3>::push_back
                (&shiftedPlaneEquations,(cbtVector3 *)&tmpVertices);
      lVar9 = lVar9 + 0x10;
    }
    tmpVertices.m_ownsMemory = true;
    tmpVertices.m_data = (cbtVector3 *)0x0;
    tmpVertices.m_size = 0;
    tmpVertices.m_capacity = 0;
    cbtGeometryUtil::getVerticesFromPlaneEquations(&shiftedPlaneEquations,&tmpVertices);
    auVar19 = ZEXT1664(ZEXT816(0) << 0x40);
    cbtConvexHullComputer::compute
              (&conv,(tmpVertices.m_data)->m_floats,0x10,tmpVertices.m_size,0.0,0.0);
    auVar16._60_4_ = 0;
    auVar16._0_60_ = extraout_var;
    auVar16 = auVar16 << 0x20;
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&tmpVertices);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&shiftedPlaneEquations);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&planeEquations);
  }
  iVar5 = conv.vertices.m_size;
  cbtAlignedObjectArray<cbtVector3>::resize
            (&this->m_polyhedron->m_vertices,conv.vertices.m_size,(cbtVector3 *)&planeEquations);
  for (lVar9 = 0; (ulong)(uint)(~(iVar5 >> 0x1f) & iVar5) << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    auVar13 = *(undefined1 (*) [16])((long)(conv.vertices.m_data)->m_floats + lVar9);
    auVar16 = ZEXT1664(auVar13);
    *(undefined1 (*) [16])((long)((this->m_polyhedron->m_vertices).m_data)->m_floats + lVar9) =
         auVar13;
  }
  for (lVar9 = 0; lVar9 < conv.faces.m_size; lVar9 = lVar9 + 1) {
    shiftedPlaneEquations.m_ownsMemory = true;
    shiftedPlaneEquations.m_data = (cbtVector3 *)0x0;
    shiftedPlaneEquations.m_size = 0;
    shiftedPlaneEquations.m_capacity = 0;
    pEVar10 = conv.edges.m_data + conv.faces.m_data[lVar9];
    iVar5 = pEVar10[conv.edges.m_data[conv.faces.m_data[lVar9]].reverse].targetVertex;
    v0 = iVar5;
    cbtAlignedObjectArray<int>::push_back((cbtAlignedObjectArray<int> *)&shiftedPlaneEquations,&v0);
    iVar6 = pEVar10->targetVertex;
    uVar8 = 0;
    v1 = iVar5;
    while( true ) {
      auVar21 = auVar19._8_56_;
      auVar17 = auVar16._8_56_;
      if (iVar6 == v0) break;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)conv.vertices.m_data[v1].m_floats;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)conv.vertices.m_data[iVar6].m_floats;
      auVar13 = vsubps_avx(auVar22,auVar18);
      auVar19 = ZEXT1664(auVar13);
      tmpVertices._0_16_ =
           vinsertps_avx(auVar13,ZEXT416((uint)(conv.vertices.m_data[iVar6].m_floats[2] -
                                               conv.vertices.m_data[v1].m_floats[2])),0x28);
      auVar16 = ZEXT1664((undefined1  [16])tmpVertices._0_16_);
      v1 = iVar6;
      cbtVector3::normalize((cbtVector3 *)&tmpVertices);
      uVar4 = 2;
      if ((int)uVar8 < 2) {
        auVar16 = ZEXT1664((undefined1  [16])tmpVertices._0_16_);
        *(undefined1 (*) [16])(&planeEquations.field_0x0 + uVar8 * 0x10) =
             (undefined1  [16])tmpVertices._0_16_;
        uVar4 = (ulong)((int)uVar8 + 1);
      }
      uVar8 = uVar4;
      cbtAlignedObjectArray<int>::push_back
                ((cbtAlignedObjectArray<int> *)&shiftedPlaneEquations,&v1);
      lVar11 = (long)pEVar10->reverse;
      iVar6 = pEVar10[lVar11 + pEVar10[lVar11].next].targetVertex;
      pEVar10 = pEVar10 + lVar11 + pEVar10[lVar11].next;
    }
    v1 = iVar6;
    cVar23 = cbtVector3::cross((cbtVector3 *)&planeEquations,(cbtVector3 *)&planeEquations.m_data);
    auVar20._0_8_ = cVar23.m_floats._8_8_;
    auVar20._8_56_ = auVar21;
    auVar19._0_8_ = cVar23.m_floats._0_8_;
    auVar19._8_56_ = auVar17;
    tmpVertices._0_16_ = vmovlhps_avx(auVar19._0_16_,auVar20._0_16_);
    cbtVector3::normalize((cbtVector3 *)&tmpVertices);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = tmpVertices._0_8_;
    auVar19 = ZEXT464((uint)tmpVertices.m_capacity);
    auVar16 = ZEXT464(0x7149f2ca);
    uVar8 = 0;
    auVar13 = vmovshdup_avx(auVar15);
    while ((uint)(~(shiftedPlaneEquations.m_size >> 0x1f) & shiftedPlaneEquations.m_size) != uVar8)
    {
      cVar2 = (shiftedPlaneEquations.m_data)->m_floats[uVar8];
      pcVar7 = (this->m_polyhedron->m_vertices).m_data;
      uVar8 = uVar8 + 1;
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * pcVar7[(int)cVar2].m_floats[1])),
                                auVar15,ZEXT416((uint)pcVar7[(int)cVar2].m_floats[0]));
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)tmpVertices.m_capacity),
                                ZEXT416((uint)pcVar7[(int)cVar2].m_floats[2]));
      auVar18 = vminss_avx(auVar18,auVar16._0_16_);
      auVar16 = ZEXT1664(auVar18);
    }
    vmovlps_avx(auVar15);
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(auVar16._0_16_,auVar13);
    auVar16 = ZEXT1664(auVar13);
    cbtAlignedObjectArray<cbtFace>::push_back
              (&this->m_polyhedron->m_faces,(cbtFace *)&shiftedPlaneEquations);
    cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<int> *)&shiftedPlaneEquations);
  }
  cbtConvexPolyhedron::initialize(this->m_polyhedron);
  cbtConvexHullComputer::~cbtConvexHullComputer(&conv);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&orgVertices);
  return true;
}

Assistant:

bool cbtPolyhedralConvexShape::initializePolyhedralFeatures(int shiftVerticesByMargin)
{
	if (m_polyhedron)
	{
		m_polyhedron->~cbtConvexPolyhedron();
		cbtAlignedFree(m_polyhedron);
	}

	void* mem = cbtAlignedAlloc(sizeof(cbtConvexPolyhedron), 16);
	m_polyhedron = new (mem) cbtConvexPolyhedron;

	cbtAlignedObjectArray<cbtVector3> orgVertices;

	for (int i = 0; i < getNumVertices(); i++)
	{
		cbtVector3& newVertex = orgVertices.expand();
		getVertex(i, newVertex);
	}

	cbtConvexHullComputer conv;

	if (shiftVerticesByMargin)
	{
		cbtAlignedObjectArray<cbtVector3> planeEquations;
		cbtGeometryUtil::getPlaneEquationsFromVertices(orgVertices, planeEquations);

		cbtAlignedObjectArray<cbtVector3> shiftedPlaneEquations;
		for (int p = 0; p < planeEquations.size(); p++)
		{
			cbtVector3 plane = planeEquations[p];
			//	   cbtScalar margin = getMargin();
			plane[3] -= getMargin();
			shiftedPlaneEquations.push_back(plane);
		}

		cbtAlignedObjectArray<cbtVector3> tmpVertices;

		cbtGeometryUtil::getVerticesFromPlaneEquations(shiftedPlaneEquations, tmpVertices);

		conv.compute(&tmpVertices[0].getX(), sizeof(cbtVector3), tmpVertices.size(), 0.f, 0.f);
	}
	else
	{
		conv.compute(&orgVertices[0].getX(), sizeof(cbtVector3), orgVertices.size(), 0.f, 0.f);
	}

#ifndef BT_RECONSTRUCT_FACES

	int numVertices = conv.vertices.size();
	m_polyhedron->m_vertices.resize(numVertices);
	for (int p = 0; p < numVertices; p++)
	{
		m_polyhedron->m_vertices[p] = conv.vertices[p];
	}

	int v0, v1;
	for (int j = 0; j < conv.faces.size(); j++)
	{
		cbtVector3 edges[3];
		int numEdges = 0;
		cbtFace combinedFace;
		const cbtConvexHullComputer::Edge* edge = &conv.edges[conv.faces[j]];
		v0 = edge->getSourceVertex();
		int prevVertex = v0;
		combinedFace.m_indices.push_back(v0);
		v1 = edge->getTargetVertex();
		while (v1 != v0)
		{
			cbtVector3 wa = conv.vertices[prevVertex];
			cbtVector3 wb = conv.vertices[v1];
			cbtVector3 newEdge = wb - wa;
			newEdge.normalize();
			if (numEdges < 2)
				edges[numEdges++] = newEdge;

			//face->addIndex(v1);
			combinedFace.m_indices.push_back(v1);
			edge = edge->getNextEdgeOfFace();
			prevVertex = v1;
			int v01 = edge->getSourceVertex();
			v1 = edge->getTargetVertex();
		}

		cbtAssert(combinedFace.m_indices.size() > 2);

		cbtVector3 faceNormal = edges[0].cross(edges[1]);
		faceNormal.normalize();

		cbtScalar planeEq = 1e30f;

		for (int v = 0; v < combinedFace.m_indices.size(); v++)
		{
			cbtScalar eq = m_polyhedron->m_vertices[combinedFace.m_indices[v]].dot(faceNormal);
			if (planeEq > eq)
			{
				planeEq = eq;
			}
		}
		combinedFace.m_plane[0] = faceNormal.getX();
		combinedFace.m_plane[1] = faceNormal.getY();
		combinedFace.m_plane[2] = faceNormal.getZ();
		combinedFace.m_plane[3] = -planeEq;

		m_polyhedron->m_faces.push_back(combinedFace);
	}

#else  //BT_RECONSTRUCT_FACES

	cbtAlignedObjectArray<cbtVector3> faceNormals;
	int numFaces = conv.faces.size();
	faceNormals.resize(numFaces);
	cbtConvexHullComputer* convexUtil = &conv;

	cbtAlignedObjectArray<cbtFace> tmpFaces;
	tmpFaces.resize(numFaces);

	int numVertices = convexUtil->vertices.size();
	m_polyhedron->m_vertices.resize(numVertices);
	for (int p = 0; p < numVertices; p++)
	{
		m_polyhedron->m_vertices[p] = convexUtil->vertices[p];
	}

	for (int i = 0; i < numFaces; i++)
	{
		int face = convexUtil->faces[i];
		//printf("face=%d\n",face);
		const cbtConvexHullComputer::Edge* firstEdge = &convexUtil->edges[face];
		const cbtConvexHullComputer::Edge* edge = firstEdge;

		cbtVector3 edges[3];
		int numEdges = 0;
		//compute face normals

		do
		{
			int src = edge->getSourceVertex();
			tmpFaces[i].m_indices.push_back(src);
			int targ = edge->getTargetVertex();
			cbtVector3 wa = convexUtil->vertices[src];

			cbtVector3 wb = convexUtil->vertices[targ];
			cbtVector3 newEdge = wb - wa;
			newEdge.normalize();
			if (numEdges < 2)
				edges[numEdges++] = newEdge;

			edge = edge->getNextEdgeOfFace();
		} while (edge != firstEdge);

		cbtScalar planeEq = 1e30f;

		if (numEdges == 2)
		{
			faceNormals[i] = edges[0].cross(edges[1]);
			faceNormals[i].normalize();
			tmpFaces[i].m_plane[0] = faceNormals[i].getX();
			tmpFaces[i].m_plane[1] = faceNormals[i].getY();
			tmpFaces[i].m_plane[2] = faceNormals[i].getZ();
			tmpFaces[i].m_plane[3] = planeEq;
		}
		else
		{
			cbtAssert(0);  //degenerate?
			faceNormals[i].setZero();
		}

		for (int v = 0; v < tmpFaces[i].m_indices.size(); v++)
		{
			cbtScalar eq = m_polyhedron->m_vertices[tmpFaces[i].m_indices[v]].dot(faceNormals[i]);
			if (planeEq > eq)
			{
				planeEq = eq;
			}
		}
		tmpFaces[i].m_plane[3] = -planeEq;
	}

	//merge coplanar faces and copy them to m_polyhedron

	cbtScalar faceWeldThreshold = 0.999f;
	cbtAlignedObjectArray<int> todoFaces;
	for (int i = 0; i < tmpFaces.size(); i++)
		todoFaces.push_back(i);

	while (todoFaces.size())
	{
		cbtAlignedObjectArray<int> coplanarFaceGroup;
		int refFace = todoFaces[todoFaces.size() - 1];

		coplanarFaceGroup.push_back(refFace);
		cbtFace& faceA = tmpFaces[refFace];
		todoFaces.pop_back();

		cbtVector3 faceNormalA(faceA.m_plane[0], faceA.m_plane[1], faceA.m_plane[2]);
		for (int j = todoFaces.size() - 1; j >= 0; j--)
		{
			int i = todoFaces[j];
			cbtFace& faceB = tmpFaces[i];
			cbtVector3 faceNormalB(faceB.m_plane[0], faceB.m_plane[1], faceB.m_plane[2]);
			if (faceNormalA.dot(faceNormalB) > faceWeldThreshold)
			{
				coplanarFaceGroup.push_back(i);
				todoFaces.remove(i);
			}
		}

		bool did_merge = false;
		if (coplanarFaceGroup.size() > 1)
		{
			//do the merge: use Graham Scan 2d convex hull

			cbtAlignedObjectArray<GrahamVector3> orgpoints;
			cbtVector3 averageFaceNormal(0, 0, 0);

			for (int i = 0; i < coplanarFaceGroup.size(); i++)
			{
				//				m_polyhedron->m_faces.push_back(tmpFaces[coplanarFaceGroup[i]]);

				cbtFace& face = tmpFaces[coplanarFaceGroup[i]];
				cbtVector3 faceNormal(face.m_plane[0], face.m_plane[1], face.m_plane[2]);
				averageFaceNormal += faceNormal;
				for (int f = 0; f < face.m_indices.size(); f++)
				{
					int orgIndex = face.m_indices[f];
					cbtVector3 pt = m_polyhedron->m_vertices[orgIndex];

					bool found = false;

					for (int i = 0; i < orgpoints.size(); i++)
					{
						//if ((orgpoints[i].m_orgIndex == orgIndex) || ((rotatedPt-orgpoints[i]).length2()<0.0001))
						if (orgpoints[i].m_orgIndex == orgIndex)
						{
							found = true;
							break;
						}
					}
					if (!found)
						orgpoints.push_back(GrahamVector3(pt, orgIndex));
				}
			}

			cbtFace combinedFace;
			for (int i = 0; i < 4; i++)
				combinedFace.m_plane[i] = tmpFaces[coplanarFaceGroup[0]].m_plane[i];

			cbtAlignedObjectArray<GrahamVector3> hull;

			averageFaceNormal.normalize();
			GrahamScanConvexHull2D(orgpoints, hull, averageFaceNormal);

			for (int i = 0; i < hull.size(); i++)
			{
				combinedFace.m_indices.push_back(hull[i].m_orgIndex);
				for (int k = 0; k < orgpoints.size(); k++)
				{
					if (orgpoints[k].m_orgIndex == hull[i].m_orgIndex)
					{
						orgpoints[k].m_orgIndex = -1;  // invalidate...
						break;
					}
				}
			}

			// are there rejected vertices?
			bool reject_merge = false;

			for (int i = 0; i < orgpoints.size(); i++)
			{
				if (orgpoints[i].m_orgIndex == -1)
					continue;  // this is in the hull...
				// this vertex is rejected -- is anybody else using this vertex?
				for (int j = 0; j < tmpFaces.size(); j++)
				{
					cbtFace& face = tmpFaces[j];
					// is this a face of the current coplanar group?
					bool is_in_current_group = false;
					for (int k = 0; k < coplanarFaceGroup.size(); k++)
					{
						if (coplanarFaceGroup[k] == j)
						{
							is_in_current_group = true;
							break;
						}
					}
					if (is_in_current_group)  // ignore this face...
						continue;
					// does this face use this rejected vertex?
					for (int v = 0; v < face.m_indices.size(); v++)
					{
						if (face.m_indices[v] == orgpoints[i].m_orgIndex)
						{
							// this rejected vertex is used in another face -- reject merge
							reject_merge = true;
							break;
						}
					}
					if (reject_merge)
						break;
				}
				if (reject_merge)
					break;
			}

			if (!reject_merge)
			{
				// do this merge!
				did_merge = true;
				m_polyhedron->m_faces.push_back(combinedFace);
			}
		}
		if (!did_merge)
		{
			for (int i = 0; i < coplanarFaceGroup.size(); i++)
			{
				cbtFace face = tmpFaces[coplanarFaceGroup[i]];
				m_polyhedron->m_faces.push_back(face);
			}
		}
	}

#endif  //BT_RECONSTRUCT_FACES

	m_polyhedron->initialize();

	return true;
}